

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int perform_getsock(Curl_easy *data,curl_socket_t *sock)

{
  connectdata *pcVar1;
  _Bool _Var2;
  bool bVar3;
  bool local_30;
  uint local_2c;
  uint sockindex;
  int bitmap;
  connectdata *conn;
  curl_socket_t *sock_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if (pcVar1 == (connectdata *)0x0) {
    data_local._4_4_ = 0;
  }
  else if (pcVar1->handler->perform_getsock ==
           (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0) {
    local_30 = false;
    bVar3 = ((data->req).keepon & 0x15U) == 1;
    if (bVar3) {
      *sock = pcVar1->sockfd;
    }
    local_2c = (uint)bVar3;
    _Var2 = Curl_req_want_send(data);
    if (_Var2) {
      if ((pcVar1->sockfd != pcVar1->writesockfd) || (local_2c == 0)) {
        local_30 = local_2c != 0;
        sock[local_30] = pcVar1->writesockfd;
      }
      local_2c = 1 << (local_30 + 0x10U & 0x1f) | local_2c;
    }
    data_local._4_4_ = local_2c;
  }
  else {
    data_local._4_4_ = (*pcVar1->handler->perform_getsock)(data,pcVar1,sock);
  }
  return data_local._4_4_;
}

Assistant:

static int perform_getsock(struct Curl_easy *data, curl_socket_t *sock)
{
  struct connectdata *conn = data->conn;
  if(!conn)
    return GETSOCK_BLANK;
  else if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(data, conn, sock);
  else {
    /* Default is to obey the data->req.keepon flags for send/recv */
    int bitmap = GETSOCK_BLANK;
    unsigned sockindex = 0;
    if(CURL_WANT_RECV(data)) {
      DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);
      bitmap |= GETSOCK_READSOCK(sockindex);
      sock[sockindex] = conn->sockfd;
    }

    if(Curl_req_want_send(data)) {
      if((conn->sockfd != conn->writesockfd) ||
         bitmap == GETSOCK_BLANK) {
        /* only if they are not the same socket and we have a readable
           one, we increase index */
        if(bitmap != GETSOCK_BLANK)
          sockindex++; /* increase index if we need two entries */

        DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);
        sock[sockindex] = conn->writesockfd;
      }
      bitmap |= GETSOCK_WRITESOCK(sockindex);
    }
    return bitmap;
  }
}